

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::Compiler::evaluate_spec_constant_u32(Compiler *this,SPIRConstantOp *spec)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRType *type;
  CompilerError *pCVar4;
  uint *puVar5;
  uint local_e8;
  int32_t b_4;
  int32_t a_4;
  uint32_t b_3;
  uint32_t a_3;
  int32_t v;
  int32_t b_2;
  int32_t a_2;
  int32_t b_1;
  int32_t a_1;
  uint32_t b;
  uint32_t a;
  anon_class_8_1_8991fb9c eval_u32;
  uint32_t value;
  SPIRType *result_type;
  SPIRConstantOp *spec_local;
  Compiler *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&spec->basetype);
  type = get<spirv_cross::SPIRType>(this,uVar2);
  if (((type->basetype != UInt) && (type->basetype != Int)) && (type->basetype != Boolean)) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (pCVar4,
               "Only 32-bit integers and booleans are currently supported when evaluating specialization constants.\n"
              );
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  bVar1 = is_scalar(this,type);
  if (!bVar1) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar4,"Spec constant evaluation must be a scalar.\n");
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  eval_u32.this._0_4_ = 0;
  _b = this;
  switch(*(undefined4 *)&(spec->super_IVariant).field_0xc) {
  case 0x7e:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = -uVar2;
    break;
  default:
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar4,"Unsupported spec constant opcode for evaluation.\n");
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case 0x80:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = uVar2 + uVar3;
    break;
  case 0x82:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = uVar2 - uVar3;
    break;
  case 0x84:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = uVar2 * uVar3;
    break;
  case 0x86:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    if (uVar3 == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Undefined behavior in UDiv, b == 0.\n");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    eval_u32.this._0_4_ = uVar2 / uVar3;
    break;
  case 0x87:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    if (uVar3 == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Undefined behavior in SDiv, b == 0.\n");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    eval_u32.this._0_4_ = (int)uVar2 / (int)uVar3;
    break;
  case 0x89:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    if (uVar3 == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Undefined behavior in UMod, b == 0.\n");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    eval_u32.this._0_4_ = uVar2 % uVar3;
    break;
  case 0x8a:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    if (uVar3 == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Undefined behavior in SRem, b == 0.\n");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    eval_u32.this._0_4_ = (int)uVar2 % (int)uVar3;
    break;
  case 0x8b:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    if (uVar3 == 0) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar4,"Undefined behavior in SMod, b == 0.\n");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    b_3 = (int)uVar2 % (int)uVar3;
    if ((((int)uVar3 < 0) && (0 < (int)b_3)) || ((0 < (int)uVar3 && ((int)b_3 < 0)))) {
      b_3 = uVar3 + b_3;
    }
    eval_u32.this._0_4_ = b_3;
    break;
  case 0xa4:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = (uint)(uVar2 == uVar3);
    break;
  case 0xa5:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = (uint)(uVar2 != uVar3);
    break;
  case 0xa6:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = uVar2 | uVar3;
    break;
  case 0xa7:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = uVar2 & uVar3;
    break;
  case 0xa8:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = (uint)((uVar2 != 0 ^ 0xffU) & 1);
    break;
  case 0xa9:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    if (uVar2 == 0) {
      puVar5 = VectorView<unsigned_int>::operator[]
                         (&(spec->arguments).super_VectorView<unsigned_int>,2);
      local_e8 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    }
    else {
      puVar5 = VectorView<unsigned_int>::operator[]
                         (&(spec->arguments).super_VectorView<unsigned_int>,1);
      local_e8 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    }
    eval_u32.this._0_4_ = local_e8;
    break;
  case 0xaa:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = (uint)(uVar2 == uVar3);
    break;
  case 0xab:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = (uint)(uVar2 != uVar3);
    break;
  case 0xac:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = (uint)(uVar3 < uVar2);
    break;
  case 0xad:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = (uint)((int)uVar3 < (int)uVar2);
    break;
  case 0xae:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = (uint)(uVar3 <= uVar2);
    break;
  case 0xaf:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = (uint)((int)uVar3 <= (int)uVar2);
    break;
  case 0xb0:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = (uint)(uVar2 < uVar3);
    break;
  case 0xb1:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = (uint)((int)uVar2 < (int)uVar3);
    break;
  case 0xb2:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = (uint)(uVar2 <= uVar3);
    break;
  case 0xb3:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = (uint)((int)uVar2 <= (int)uVar3);
    break;
  case 0xc2:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = uVar2 >> ((byte)uVar3 & 0x1f);
    break;
  case 0xc3:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = (int)uVar2 >> ((byte)uVar3 & 0x1f);
    break;
  case 0xc4:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = uVar2 << ((byte)uVar3 & 0x1f);
    break;
  case 0xc5:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = uVar2 | uVar3;
    break;
  case 0xc6:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = uVar2 ^ uVar3;
    break;
  case 199:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,1);
    uVar3 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = uVar2 & uVar3;
    break;
  case 200:
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(spec->arguments).super_VectorView<unsigned_int>,0);
    uVar2 = evaluate_spec_constant_u32::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&b,*puVar5);
    eval_u32.this._0_4_ = uVar2 ^ 0xffffffff;
  }
  return (uint)eval_u32.this;
}

Assistant:

uint32_t Compiler::evaluate_spec_constant_u32(const SPIRConstantOp &spec) const
{
	auto &result_type = get<SPIRType>(spec.basetype);
	if (result_type.basetype != SPIRType::UInt && result_type.basetype != SPIRType::Int &&
	    result_type.basetype != SPIRType::Boolean)
	{
		SPIRV_CROSS_THROW(
		    "Only 32-bit integers and booleans are currently supported when evaluating specialization constants.\n");
	}

	if (!is_scalar(result_type))
		SPIRV_CROSS_THROW("Spec constant evaluation must be a scalar.\n");

	uint32_t value = 0;

	const auto eval_u32 = [&](uint32_t id) -> uint32_t {
		auto &type = expression_type(id);
		if (type.basetype != SPIRType::UInt && type.basetype != SPIRType::Int && type.basetype != SPIRType::Boolean)
		{
			SPIRV_CROSS_THROW("Only 32-bit integers and booleans are currently supported when evaluating "
			                  "specialization constants.\n");
		}

		if (!is_scalar(type))
			SPIRV_CROSS_THROW("Spec constant evaluation must be a scalar.\n");
		if (const auto *c = this->maybe_get<SPIRConstant>(id))
			return c->scalar();
		else
			return evaluate_spec_constant_u32(this->get<SPIRConstantOp>(id));
	};

#define binary_spec_op(op, binary_op)                                              \
	case Op##op:                                                                   \
		value = eval_u32(spec.arguments[0]) binary_op eval_u32(spec.arguments[1]); \
		break
#define binary_spec_op_cast(op, binary_op, type)                                                         \
	case Op##op:                                                                                         \
		value = uint32_t(type(eval_u32(spec.arguments[0])) binary_op type(eval_u32(spec.arguments[1]))); \
		break

	// Support the basic opcodes which are typically used when computing array sizes.
	switch (spec.opcode)
	{
		binary_spec_op(IAdd, +);
		binary_spec_op(ISub, -);
		binary_spec_op(IMul, *);
		binary_spec_op(BitwiseAnd, &);
		binary_spec_op(BitwiseOr, |);
		binary_spec_op(BitwiseXor, ^);
		binary_spec_op(LogicalAnd, &);
		binary_spec_op(LogicalOr, |);
		binary_spec_op(ShiftLeftLogical, <<);
		binary_spec_op(ShiftRightLogical, >>);
		binary_spec_op_cast(ShiftRightArithmetic, >>, int32_t);
		binary_spec_op(LogicalEqual, ==);
		binary_spec_op(LogicalNotEqual, !=);
		binary_spec_op(IEqual, ==);
		binary_spec_op(INotEqual, !=);
		binary_spec_op(ULessThan, <);
		binary_spec_op(ULessThanEqual, <=);
		binary_spec_op(UGreaterThan, >);
		binary_spec_op(UGreaterThanEqual, >=);
		binary_spec_op_cast(SLessThan, <, int32_t);
		binary_spec_op_cast(SLessThanEqual, <=, int32_t);
		binary_spec_op_cast(SGreaterThan, >, int32_t);
		binary_spec_op_cast(SGreaterThanEqual, >=, int32_t);
#undef binary_spec_op
#undef binary_spec_op_cast

	case OpLogicalNot:
		value = uint32_t(!eval_u32(spec.arguments[0]));
		break;

	case OpNot:
		value = ~eval_u32(spec.arguments[0]);
		break;

	case OpSNegate:
		value = uint32_t(-int32_t(eval_u32(spec.arguments[0])));
		break;

	case OpSelect:
		value = eval_u32(spec.arguments[0]) ? eval_u32(spec.arguments[1]) : eval_u32(spec.arguments[2]);
		break;

	case OpUMod:
	{
		uint32_t a = eval_u32(spec.arguments[0]);
		uint32_t b = eval_u32(spec.arguments[1]);
		if (b == 0)
			SPIRV_CROSS_THROW("Undefined behavior in UMod, b == 0.\n");
		value = a % b;
		break;
	}

	case OpSRem:
	{
		auto a = int32_t(eval_u32(spec.arguments[0]));
		auto b = int32_t(eval_u32(spec.arguments[1]));
		if (b == 0)
			SPIRV_CROSS_THROW("Undefined behavior in SRem, b == 0.\n");
		value = a % b;
		break;
	}

	case OpSMod:
	{
		auto a = int32_t(eval_u32(spec.arguments[0]));
		auto b = int32_t(eval_u32(spec.arguments[1]));
		if (b == 0)
			SPIRV_CROSS_THROW("Undefined behavior in SMod, b == 0.\n");
		auto v = a % b;

		// Makes sure we match the sign of b, not a.
		if ((b < 0 && v > 0) || (b > 0 && v < 0))
			v += b;
		value = v;
		break;
	}

	case OpUDiv:
	{
		uint32_t a = eval_u32(spec.arguments[0]);
		uint32_t b = eval_u32(spec.arguments[1]);
		if (b == 0)
			SPIRV_CROSS_THROW("Undefined behavior in UDiv, b == 0.\n");
		value = a / b;
		break;
	}

	case OpSDiv:
	{
		auto a = int32_t(eval_u32(spec.arguments[0]));
		auto b = int32_t(eval_u32(spec.arguments[1]));
		if (b == 0)
			SPIRV_CROSS_THROW("Undefined behavior in SDiv, b == 0.\n");
		value = a / b;
		break;
	}

	default:
		SPIRV_CROSS_THROW("Unsupported spec constant opcode for evaluation.\n");
	}

	return value;
}

uint32_t Compiler::evaluate_constant_u32(uint32_t id) const
{
	if (const auto *c = maybe_get<SPIRConstant>(id))
		return c->scalar();
	else
		return evaluate_spec_constant_u32(get<SPIRConstantOp>(id));
}

size_t Compiler::get_declared_struct_member_size(const SPIRType &struct_type, uint32_t index) const
{
	if (struct_type.member_types.empty())
		SPIRV_CROSS_THROW("Declared struct in block cannot be empty.");

	auto &flags = get_member_decoration_bitset(struct_type.self, index);
	auto &type = get<SPIRType>(struct_type.member_types[index]);

	switch (type.basetype)
	{
	case SPIRType::Unknown:
	case SPIRType::Void:
	case SPIRType::Boolean: // Bools are purely logical, and cannot be used for externally visible types.
	case SPIRType::AtomicCounter:
	case SPIRType::Image:
	case SPIRType::SampledImage:
	case SPIRType::Sampler:
		SPIRV_CROSS_THROW("Querying size for object with opaque size.");

	default:
		break;
	}

	if (type.pointer && type.storage == StorageClassPhysicalStorageBuffer)
	{
		// Check if this is a top-level pointer type, and not an array of pointers.
		if (type.pointer_depth > get<SPIRType>(type.parent_type).pointer_depth)
			return 8;
	}

	if (!type.array.empty())
	{
		// For arrays, we can use ArrayStride to get an easy check.
		bool array_size_literal = type.array_size_literal.back();
		uint32_t array_size = array_size_literal ? type.array.back() : evaluate_constant_u32(type.array.back());
		return type_struct_member_array_stride(struct_type, index) * array_size;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		return get_declared_struct_size(type);
	}
	else
	{
		unsigned vecsize = type.vecsize;
		unsigned columns = type.columns;

		// Vectors.
		if (columns == 1)
		{
			size_t component_size = type.width / 8;
			return vecsize * component_size;
		}
		else
		{
			uint32_t matrix_stride = type_struct_member_matrix_stride(struct_type, index);

			// Per SPIR-V spec, matrices must be tightly packed and aligned up for vec3 accesses.
			if (flags.get(DecorationRowMajor))
				return matrix_stride * vecsize;
			else if (flags.get(DecorationColMajor))
				return matrix_stride * columns;
			else
				SPIRV_CROSS_THROW("Either row-major or column-major must be declared for matrices.");
		}
	}